

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

void copy_values_to_match_command(Am_Object *match_command,Am_Value *items_value)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  Am_Value *pAVar3;
  Am_Wrapper *value_00;
  Am_Am_Slot_Key local_92;
  undefined1 local_90 [8];
  Am_Value_List slots_to_save;
  Am_Value value;
  Am_Object script_part;
  undefined1 local_60 [6];
  Am_Am_Slot_Key slot;
  Am_Value_List parts;
  Am_Object start_object;
  Am_Object main_cmd;
  Am_Object local_30;
  Am_Object script_group;
  Am_Value_List items;
  Am_Value *items_value_local;
  Am_Object *match_command_local;
  
  Am_Value_List::Am_Value_List((Am_Value_List *)&script_group,items_value);
  pAVar3 = Am_Value_List::Get_First((Am_Value_List *)&script_group);
  Am_Object::Am_Object(&local_30,pAVar3);
  pAVar3 = Am_Object::Get(&local_30,0xc5,0);
  Am_Object::Am_Object(&start_object,pAVar3);
  pAVar3 = Am_Object::Peek(&start_object,0x11a,0);
  Am_Object::Am_Object((Am_Object *)&parts.item,pAVar3);
  pAVar3 = Am_Object::Get(&local_30,0x82,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_60,pAVar3);
  Am_Am_Slot_Key::Am_Am_Slot_Key((Am_Am_Slot_Key *)((long)&script_part.data + 6),0);
  Am_Object::Am_Object((Am_Object *)&value.value);
  Am_Value::Am_Value((Am_Value *)&slots_to_save.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_90);
  Am_Value_List::Start((Am_Value_List *)local_60);
  while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_60), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar3 = Am_Value_List::Get((Am_Value_List *)local_60);
    Am_Object::operator=((Am_Object *)&value.value,pAVar3);
    pAVar3 = Am_Object::Get((Am_Object *)&value.value,0xb8,3);
    Am_Am_Slot_Key::Am_Am_Slot_Key(&local_92,pAVar3);
    script_part.data._6_2_ = local_92.value;
    AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                      ((Am_Am_Slot_Key *)((long)&script_part.data + 6));
    if (AVar2 != 0) {
      AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                        ((Am_Am_Slot_Key *)((long)&script_part.data + 6));
      Am_Value_List::Add((Am_Value_List *)local_90,(uint)AVar2,Am_TAIL,true);
      AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                        ((Am_Am_Slot_Key *)((long)&script_part.data + 6));
      pAVar3 = Am_Object::Peek(&start_object,AVar2,0);
      Am_Value::operator=((Am_Value *)&slots_to_save.item,pAVar3);
      bVar1 = Am_Value::Valid((Am_Value *)&slots_to_save.item);
      if ((!bVar1) && (bVar1 = Am_Object::Valid((Am_Object *)&parts.item), bVar1)) {
        AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                          ((Am_Am_Slot_Key *)((long)&script_part.data + 6));
        pAVar3 = Am_Object::Peek((Am_Object *)&parts.item,AVar2,0);
        Am_Value::operator=((Am_Value *)&slots_to_save.item,pAVar3);
      }
      bVar1 = Am_Value::Valid((Am_Value *)&slots_to_save.item);
      if (bVar1) {
        AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                          ((Am_Am_Slot_Key *)((long)&script_part.data + 6));
        Am_Object::Set(match_command,AVar2,(Am_Value *)&slots_to_save.item,1);
      }
    }
    Am_Value_List::Next((Am_Value_List *)local_60);
  }
  value_00 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_90);
  Am_Object::Set(match_command,0xb8,value_00,0);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_90);
  Am_Value::~Am_Value((Am_Value *)&slots_to_save.item);
  Am_Object::~Am_Object((Am_Object *)&value.value);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_60);
  Am_Object::~Am_Object((Am_Object *)&parts.item);
  Am_Object::~Am_Object(&start_object);
  Am_Object::~Am_Object(&local_30);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&script_group);
  return;
}

Assistant:

void
copy_values_to_match_command(Am_Object &match_command,
                             const Am_Value &items_value)
{
  Am_Value_List items = items_value;
  Am_Object script_group = items.Get_First();
  Am_Object main_cmd = script_group.Get(Am_COMMAND);
  //only used in create cmds
  Am_Object start_object = main_cmd.Peek(Am_START_OBJECT);
  Am_Value_List parts = script_group.Get(Am_GRAPHICAL_PARTS);
  Am_Am_Slot_Key slot;
  Am_Object script_part;
  Am_Value value;
  Am_Value_List slots_to_save;
  for (parts.Start(); !parts.Last(); parts.Next()) {
    script_part = parts.Get();
    slot = Am_Am_Slot_Key(
        script_part.Get(Am_SLOTS_TO_SAVE, Am_RETURN_ZERO_ON_ERROR));
    if ((int)slot != 0) {
      slots_to_save.Add(static_cast<int>(slot));
      value = main_cmd.Peek(slot);
      if (!value.Valid()) {
        if (start_object.Valid())
          value = start_object.Peek(slot);
      }
      if (value.Valid())
        match_command.Set(slot, value, Am_OK_IF_NOT_THERE);
    }
  }
  match_command.Set(Am_SLOTS_TO_SAVE, slots_to_save);
}